

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::ExpensiveSign(S2Point *a,S2Point *b,S2Point *c,bool perturb)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  double *ap_2;
  double *ap_1;
  double *ap;
  
  dVar2 = a->c_[0];
  dVar3 = b->c_[0];
  if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
    lVar6 = 0;
    do {
      if (lVar6 == 0x10) {
        return 0;
      }
      dVar4 = *(double *)((long)a->c_ + lVar6 + 8);
      pdVar1 = (double *)((long)b->c_ + lVar6 + 8);
      lVar6 = lVar6 + 8;
    } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
  }
  dVar4 = c->c_[0];
  if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
    lVar6 = 0;
    do {
      if (lVar6 == 0x10) {
        return 0;
      }
      dVar3 = *(double *)((long)b->c_ + lVar6 + 8);
      pdVar1 = (double *)((long)c->c_ + lVar6 + 8);
      lVar6 = lVar6 + 8;
    } while ((dVar3 == *pdVar1) && (!NAN(dVar3) && !NAN(*pdVar1)));
  }
  if ((dVar4 == dVar2) && (!NAN(dVar4) && !NAN(dVar2))) {
    lVar6 = 0;
    do {
      if (lVar6 == 0x10) {
        return 0;
      }
      dVar2 = *(double *)((long)c->c_ + lVar6 + 8);
      pdVar1 = (double *)((long)a->c_ + lVar6 + 8);
      lVar6 = lVar6 + 8;
    } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
  }
  iVar5 = StableSign(a,b,c);
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = ExactSign(a,b,c,perturb);
  return iVar5;
}

Assistant:

int ExpensiveSign(const S2Point& a, const S2Point& b, const S2Point& c,
                  bool perturb) {
  // Return zero if and only if two points are the same.  This ensures (1).
  if (a == b || b == c || c == a) return 0;

  // Next we try recomputing the determinant still using floating-point
  // arithmetic but in a more precise way.  This is more expensive than the
  // simple calculation done by TriageSign(), but it is still *much* cheaper
  // than using arbitrary-precision arithmetic.  This optimization is able to
  // compute the correct determinant sign in virtually all cases except when
  // the three points are truly collinear (e.g., three points on the equator).
  int det_sign = StableSign(a, b, c);
  if (det_sign != 0) return det_sign;

  // TODO(ericv): Create a templated version of StableSign so that we can
  // retry in "long double" precision before falling back to ExactFloat.

  // TODO(ericv): Optimize ExactFloat so that it stores up to 32 bytes of
  // mantissa inline (without requiring memory allocation).

  // Otherwise fall back to exact arithmetic and symbolic permutations.
  return ExactSign(a, b, c, perturb);
}